

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O1

ifstream * amrex::VisMF::OpenStream(string *fileName)

{
  pointer pcVar1;
  long lVar2;
  mapped_type *pmVar3;
  ifstream *this;
  
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::VisMF::PersistentIFStream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::VisMF::PersistentIFStream>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::VisMF::PersistentIFStream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::VisMF::PersistentIFStream>_>_>
                         *)persistentIFStreams_abi_cxx11_,fileName);
  if (pmVar3->isOpen == false) {
    this = (ifstream *)operator_new(0x208);
    std::ifstream::ifstream(this);
    pmVar3->pstr = this;
    if (setBuf == '\x01') {
      std::vector<char,_std::allocator<char>_>::resize
                (&(pmVar3->ioBuffer).super_vector<char,_std::allocator<char>_>,
                 VisMFBuffer::ioBufferSize);
      pcVar1 = (pmVar3->ioBuffer).super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
      (**(code **)(*(long *)(pmVar3->pstr + 0x10) + 0x18))
                (pmVar3->pstr + 0x10,pcVar1,
                 (long)(pmVar3->ioBuffer).super_vector<char,_std::allocator<char>_>.
                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pcVar1);
    }
    std::ifstream::open((char *)pmVar3->pstr,(_Ios_Openmode)(fileName->_M_dataplus)._M_p);
    lVar2 = *(long *)pmVar3->pstr;
    if (*(int *)(pmVar3->pstr + *(long *)(lVar2 + -0x18) + 0x20) != 0) {
      (**(code **)(lVar2 + 8))();
      pmVar3->pstr = (ifstream *)0x0;
      FileOpenFailed(fileName);
    }
    pmVar3->isOpen = true;
    (pmVar3->currentPosition)._M_off = 0;
    (pmVar3->currentPosition)._M_state.__count = 0;
    (pmVar3->currentPosition)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  }
  return pmVar3->pstr;
}

Assistant:

std::ifstream *VisMF::OpenStream(const std::string &fileName) {
  VisMF::PersistentIFStream &pifs = VisMF::persistentIFStreams[fileName];
  if( ! pifs.isOpen) {
    pifs.pstr = new std::ifstream;
    if(setBuf) {
      pifs.ioBuffer.resize(ioBufferSize);
      pifs.pstr->rdbuf()->pubsetbuf(pifs.ioBuffer.dataPtr(), pifs.ioBuffer.size());
    }
    pifs.pstr->open(fileName.c_str(), std::ios::in | std::ios::binary);
    if( ! pifs.pstr->good()) {
      delete pifs.pstr;
      pifs.pstr = nullptr;
      amrex::FileOpenFailed(fileName);
    }
    pifs.isOpen = true;
    pifs.currentPosition = 0;
  }

  return pifs.pstr;
}